

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O0

void __thiscall HttpData::newEvent(HttpData *this)

{
  EventLoop *this_00;
  element_type *this_01;
  shared_ptr<Channel> local_20;
  HttpData *local_10;
  HttpData *this_local;
  
  local_10 = this;
  this_01 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &this->channel_);
  Channel::setEvents(this_01,0xc0000001);
  this_00 = this->loop_;
  std::shared_ptr<Channel>::shared_ptr(&local_20,&this->channel_);
  EventLoop::addToPoller(this_00,&local_20,2000);
  std::shared_ptr<Channel>::~shared_ptr(&local_20);
  return;
}

Assistant:

void HttpData::newEvent() {
  //cout << "new sock is coming to thread!" << " " << channel_->getFd() << endl;
  channel_->setEvents(DEFAULT_EVENT);
  loop_->addToPoller(channel_, DEFAULT_EXPIRED_TIME);
}